

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         write_significand<fmt::v8::appender,char,char_const*,fmt::v8::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  appender aVar1;
  basic_string_view<char> digits;
  undefined1 local_238 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  
  if ((grouping->sep_).thousands_sep != '\0') {
    buffer.super_buffer<char>._vptr_buffer = (_func_int **)&buffer.super_buffer<char>.capacity_;
    buffer.super_buffer<char>.ptr_ = (char *)0x0;
    local_238 = (undefined1  [8])&PTR_grow_00219938;
    buffer.super_buffer<char>.size_ = 500;
    write_significand<fmt::v8::appender,char>
              ((appender)local_238,significand,significand_size,integral_size,decimal_point);
    digits.size_._0_4_ = integral_size;
    digits.data_ = (char *)buffer.super_buffer<char>._vptr_buffer;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    aVar1 = copy_str_noinline<char,char*,fmt::v8::appender>
                      ((char *)((long)integral_size + (long)buffer.super_buffer<char>._vptr_buffer),
                       (char *)((long)buffer.super_buffer<char>._vptr_buffer +
                               (long)buffer.super_buffer<char>.ptr_),out);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_238);
    return (appender)
           aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  aVar1 = write_significand<fmt::v8::appender,char>
                    (out,significand,significand_size,integral_size,decimal_point);
  return (appender)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}